

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_8d5133::HandleFindCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  pointer pcVar1;
  cmMakefile *this;
  char cVar2;
  int iVar3;
  pointer pbVar4;
  ulong __val;
  ulong uVar5;
  char cVar6;
  pointer pbVar7;
  bool bVar8;
  string_view value;
  string_view value_00;
  long *local_50;
  uint local_48;
  undefined4 uStack_44;
  long local_40 [2];
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pbVar4 - (long)pbVar7 >> 5) - 6U < 0xfffffffffffffffe) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command FIND requires 3 or 4 parameters.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if ((long)pbVar4 - (long)pbVar7 == 0xa0) {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 4));
      bVar8 = iVar3 == 0;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar8 = false;
    }
    if ((long)pbVar4 - (long)pbVar7 == 0xa0) {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 4));
      if (iVar3 != 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"sub-command FIND: unknown last parameter","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00242977;
      }
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    name = pbVar7 + 3;
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 != 0) {
      pcVar1 = pbVar7[2]._M_dataplus._M_p;
      if (bVar8) {
        __val = std::__cxx11::string::rfind((char *)(pbVar7 + 1),(ulong)pcVar1,0xffffffffffffffff);
      }
      else {
        __val = std::__cxx11::string::find((char *)(pbVar7 + 1),(ulong)pcVar1,0);
      }
      this = status->Makefile;
      if (__val == 0xffffffffffffffff) {
        value._M_str = "-1";
        value._M_len = 2;
        cmMakefile::AddDefinition(this,name,value);
      }
      else {
        cVar6 = '\x01';
        if (9 < __val) {
          uVar5 = __val;
          cVar2 = '\x04';
          do {
            cVar6 = cVar2;
            if (uVar5 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_00242a1b;
            }
            if (uVar5 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_00242a1b;
            }
            if (uVar5 < 10000) goto LAB_00242a1b;
            bVar8 = 99999 < uVar5;
            uVar5 = uVar5 / 10000;
            cVar2 = cVar6 + '\x04';
          } while (bVar8);
          cVar6 = cVar6 + '\x01';
        }
LAB_00242a1b:
        local_50 = local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val);
        value_00._M_len._4_4_ = uStack_44;
        value_00._M_len._0_4_ = local_48;
        value_00._M_str = (char *)local_50;
        cmMakefile::AddDefinition(this,name,value_00);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      return true;
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "sub-command FIND does not allow one to select REVERSE as the output variable.  Maybe you missed the actual output variable?"
               ,"");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_00242977:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return false;
}

Assistant:

bool HandleFindCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  // check if all required parameters were passed
  if (args.size() < 4 || args.size() > 5) {
    status.SetError("sub-command FIND requires 3 or 4 parameters.");
    return false;
  }

  // check if the reverse flag was set or not
  bool reverseMode = false;
  if (args.size() == 5 && args[4] == "REVERSE") {
    reverseMode = true;
  }

  // if we have 5 arguments the last one must be REVERSE
  if (args.size() == 5 && args[4] != "REVERSE") {
    status.SetError("sub-command FIND: unknown last parameter");
    return false;
  }

  // local parameter names.
  const std::string& sstring = args[1];
  const std::string& schar = args[2];
  const std::string& outvar = args[3];

  // ensure that the user cannot accidentally specify REVERSE as a variable
  if (outvar == "REVERSE") {
    status.SetError("sub-command FIND does not allow one to select REVERSE as "
                    "the output variable.  "
                    "Maybe you missed the actual output variable?");
    return false;
  }

  // try to find the character and return its position
  size_t pos;
  if (!reverseMode) {
    pos = sstring.find(schar);
  } else {
    pos = sstring.rfind(schar);
  }
  if (std::string::npos != pos) {
    status.GetMakefile().AddDefinition(outvar, std::to_string(pos));
    return true;
  }

  // the character was not found, but this is not really an error
  status.GetMakefile().AddDefinition(outvar, "-1");
  return true;
}